

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O2

void Abc_NtkChangePerform(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  int iVar2;
  Mio_Cell2_t *pCells;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Abc_Obj_t *pNode;
  abctime aVar3;
  long lVar4;
  int iVar5;
  Mio_Cell2_t *pMVar6;
  int local_74;
  uint local_70;
  uint local_6c;
  int fNeedInv;
  Vec_Ptr_t *local_60;
  Vec_Int_t *local_58;
  Vec_Ptr_t *local_50;
  abctime local_48;
  Mio_Cell2_t *local_40;
  int nCells;
  
  local_48 = Abc_Clock();
  local_6c = 0;
  pCells = Mio_CollectRootsNewDefault2(6,&nCells,0);
  p = Abc_NtkPrecomputeCellPairs(pCells,nCells);
  pMVar6 = pCells;
  p_00 = Abc_NtkPrecomputeFirsts(pCells,nCells);
  iVar5 = (int)pMVar6;
  local_50 = Vec_PtrAlloc(iVar5);
  local_60 = Vec_PtrAlloc(iVar5);
  local_58 = Vec_IntAlloc(100);
  local_70 = 0;
  local_74 = 0;
  local_40 = pCells;
  for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
    pNode = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vObjs,iVar5);
    if ((((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) &&
        ((1 < (pNode->vFanins).nSize || (iVar1 = Abc_NodeIsInv(pNode), iVar1 != 0)))) &&
       ((iVar1 = Abc_ObjHasDupFanouts(pNode), iVar1 == 0 &&
        (iVar1 = Abc_ObjChangeEval(pNode,p,p_00,(int)pCells[3].AreaW,&fNeedInv), 0 < iVar1)))) {
      local_70 = local_70 + 1;
      iVar2 = Abc_NodeIsInv(pNode);
      pCells = local_40;
      local_6c = local_6c + iVar2;
      local_74 = local_74 + iVar1;
      Abc_ObjChangePerform(pNode,p,p_00,fNeedInv,local_58,local_50,local_60,local_40);
    }
  }
  Vec_PtrFree(local_60);
  Vec_PtrFree(local_50);
  Vec_IntFree(local_58);
  Vec_IntFree(p_00);
  Vec_IntFree(p);
  free(pCells);
  if (fVerbose != 0) {
    iVar5 = 0x804361;
    printf("Total gain in area = %6.2f after %d changes (including %d inverters). ",
           (double)((float)local_74 / 1000.0),(ulong)local_70,(ulong)local_6c);
    aVar3 = Abc_Clock();
    lVar4 = aVar3 - local_48;
    Abc_Print(iVar5,"%s =","Time");
    Abc_Print(iVar5,"%9.2f sec\n",(double)lVar4 / 1000000.0);
  }
  return;
}

Assistant:

void Abc_NtkChangePerform( Abc_Ntk_t * pNtk, int fVerbose )
{
    abctime clk = Abc_Clock();
    int i, fNeedInv, nCells, Gain, GainAll = 0, Count = 0, CountInv = 0;
    Mio_Cell2_t * pCells = Mio_CollectRootsNewDefault2( 6, &nCells, 0 );
    Vec_Int_t * vInfo = Abc_NtkPrecomputeCellPairs( pCells, nCells );
    Vec_Int_t * vFirst = Abc_NtkPrecomputeFirsts( pCells, nCells );

    Vec_Ptr_t * vFanout = Vec_PtrAlloc( 100 );
    Vec_Ptr_t * vFanout2 = Vec_PtrAlloc( 100 );
    Vec_Int_t * vTemp = Vec_IntAlloc( 100 );
    Abc_Obj_t * pObj;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj) < 2 && !Abc_NodeIsInv(pObj) )
            continue;
        if ( Abc_ObjHasDupFanouts(pObj) )
            continue;
        Gain = Abc_ObjChangeEval( pObj, vInfo, vFirst, (int)pCells[3].AreaW, &fNeedInv );
        if ( Gain <= 0 )
            continue;
        //printf( "Obj %d\n", Abc_ObjId(pObj) );
        Count++;
        CountInv += Abc_NodeIsInv(pObj);
        GainAll += Gain;
        Abc_ObjChangePerform( pObj, vInfo, vFirst, fNeedInv, vTemp, vFanout, vFanout2, pCells );
    }
    Vec_PtrFree( vFanout2 );
    Vec_PtrFree( vFanout );
    Vec_IntFree( vTemp );

    Vec_IntFree( vFirst );
    Vec_IntFree( vInfo );
    ABC_FREE( pCells );

    if ( fVerbose )
        printf( "Total gain in area = %6.2f after %d changes (including %d inverters). ", Scl_Int2Flt(GainAll), Count, CountInv );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}